

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void qclab::printMatrix4x4<qclab::dense::SquareMatrix<double>>(SquareMatrix<double> *mat)

{
  int64_t iVar1;
  double *pdVar2;
  SquareMatrix<double> *mat_local;
  
  iVar1 = dense::SquareMatrix<double>::rows(mat);
  if (iVar1 != 4) {
    __assert_fail("mat.rows() == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/util.hpp"
                  ,0x6a,
                  "void qclab::printMatrix4x4(const T &) [T = qclab::dense::SquareMatrix<double>]");
  }
  iVar1 = dense::SquareMatrix<double>::cols(mat);
  if (iVar1 == 4) {
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,0,0);
    print<double>(*pdVar2);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,0,1);
    print<double>(*pdVar2);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,0,2);
    print<double>(*pdVar2);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,0,3);
    print<double>(*pdVar2);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,1,0);
    print<double>(*pdVar2);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,1,1);
    print<double>(*pdVar2);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,1,2);
    print<double>(*pdVar2);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,1,3);
    print<double>(*pdVar2);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,2,0);
    print<double>(*pdVar2);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,2,1);
    print<double>(*pdVar2);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,2,2);
    print<double>(*pdVar2);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,2,3);
    print<double>(*pdVar2);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,3,0);
    print<double>(*pdVar2);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,3,1);
    print<double>(*pdVar2);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,3,2);
    print<double>(*pdVar2);
    pdVar2 = dense::SquareMatrix<double>::operator()(mat,3,3);
    print<double>(*pdVar2);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    return;
  }
  __assert_fail("mat.cols() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/util.hpp"
                ,0x6b,
                "void qclab::printMatrix4x4(const T &) [T = qclab::dense::SquareMatrix<double>]");
}

Assistant:

void printMatrix4x4( const T& mat ) {
    assert( mat.rows() == 4 ) ;
    assert( mat.cols() == 4 ) ;
    print( mat(0,0) ); print( mat(0,1) ); print( mat(0,2) ); print( mat(0,3) );
    std::cout << std::endl ;
    print( mat(1,0) ); print( mat(1,1) ); print( mat(1,2) ); print( mat(1,3) );
    std::cout << std::endl ;
    print( mat(2,0) ); print( mat(2,1) ); print( mat(2,2) ); print( mat(2,3) );
    std::cout << std::endl ;
    print( mat(3,0) ); print( mat(3,1) ); print( mat(3,2) ); print( mat(3,3) );
    std::cout << std::endl ;
  }